

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::setSuspended(QFutureInterfaceBase *this,bool suspend)

{
  long lVar1;
  byte in_SIL;
  QFutureInterfaceBasePrivate *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  int in_stack_ffffffffffffff38;
  CallOutType in_stack_ffffffffffffff3c;
  QFutureCallOutEvent *in_stack_ffffffffffffff40;
  QFutureCallOutEvent *in_stack_ffffffffffffff48;
  QFutureCallOutEvent *callOutEvent;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if ((in_SIL & 1) == 0) {
    switch_off((QAtomicInt *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    QWaitCondition::wakeAll((QWaitCondition *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff40 =
         (QFutureCallOutEvent *)(in_RDI->continuationMutex).d_ptr._q_value._M_b._M_p;
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    QFutureInterfaceBasePrivate::sendCallOut(in_RDI,in_stack_ffffffffffffff48);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_ffffffffffffff40);
  }
  else {
    switch_on((QAtomicInt *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    callOutEvent = (QFutureCallOutEvent *)(in_RDI->continuationMutex).d_ptr._q_value._M_b._M_p;
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    QFutureInterfaceBasePrivate::sendCallOut(in_RDI,callOutEvent);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_ffffffffffffff40);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setSuspended(bool suspend)
{
    QMutexLocker locker(&d->m_mutex);
    if (suspend) {
        switch_on(d->state, Suspending);
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Suspending));
    } else {
        switch_off(d->state, suspendingOrSuspended);
        d->pausedWaitCondition.wakeAll();
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Resumed));
    }
}